

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas_lite.c
# Opt level: O1

int strsm_(char *side,char *uplo,char *transa,char *diag,integer *m,integer *n,real *alpha,real *a,
          integer *lda,real *b,integer *ldb)

{
  uint uVar1;
  uint uVar2;
  logical lVar3;
  logical lVar4;
  logical lVar5;
  logical lVar6;
  integer iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  real *prVar14;
  integer *piVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  real *prVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  bool bVar29;
  float fVar30;
  
  iVar24 = *lda;
  uVar8 = (ulong)iVar24;
  iVar22 = *ldb;
  uVar9 = (ulong)iVar22;
  lVar3 = lsame_(side,"L");
  piVar15 = m;
  if (lVar3 == 0) {
    piVar15 = n;
  }
  iVar21 = *piVar15;
  lVar4 = lsame_(diag,"N");
  lVar5 = lsame_(uplo,"U");
  strsm_::info = 0;
  if ((lVar3 == 0) && (lVar6 = lsame_(side,"R"), lVar6 == 0)) {
    iVar7 = 1;
  }
  else if ((lVar5 == 0) && (lVar6 = lsame_(uplo,"L"), lVar6 == 0)) {
    iVar7 = 2;
  }
  else {
    lVar6 = lsame_(transa,"N");
    if (((lVar6 == 0) && (lVar6 = lsame_(transa,"T"), lVar6 == 0)) &&
       (lVar6 = lsame_(transa,"C"), lVar6 == 0)) {
      iVar7 = 3;
    }
    else {
      lVar6 = lsame_(diag,"U");
      if ((lVar6 == 0) && (lVar6 = lsame_(diag,"N"), lVar6 == 0)) {
        iVar7 = 4;
      }
      else {
        iVar27 = *m;
        if (iVar27 < 0) {
          iVar7 = 5;
        }
        else if (*n < 0) {
          iVar7 = 6;
        }
        else {
          if (iVar21 < 2) {
            iVar21 = 1;
          }
          iVar7 = 9;
          if (iVar21 <= *lda) {
            iVar21 = 1;
            if (1 < iVar27) {
              iVar21 = iVar27;
            }
            iVar7 = 0xb;
            if (iVar21 <= *ldb) goto LAB_001208b7;
          }
        }
      }
    }
  }
  strsm_::info = iVar7;
LAB_001208b7:
  if (strsm_::info == 0) {
    uVar1 = *n;
    if ((ulong)uVar1 != 0) {
      uVar26 = ~uVar9;
      if ((*alpha != 0.0) || (NAN(*alpha))) {
        uVar28 = ~uVar8;
        lVar6 = lsame_(transa,"N");
        uVar1 = *n;
        uVar11 = (ulong)uVar1;
        if (lVar3 == 0) {
          if (lVar6 == 0) {
            if (lVar5 == 0) {
              strsm_::k = 1;
              if (0 < (int)uVar1) {
                iVar21 = *n;
                strsm_::k = 1;
                prVar14 = b + uVar26 + uVar9;
                lVar17 = 1;
                do {
                  if (lVar4 != 0) {
                    uVar1 = *m;
                    if ((int)uVar1 < 1) {
                      lVar19 = 1;
                    }
                    else {
                      fVar30 = a[uVar28 + (long)((iVar24 + 1) * (int)lVar17)];
                      lVar19 = 1;
                      do {
                        prVar14[lVar19] = prVar14[lVar19] * (1.0 / fVar30);
                        lVar19 = lVar19 + 1;
                      } while ((ulong)uVar1 + 1 != lVar19);
                    }
                    strsm_::i__ = (integer)lVar19;
                  }
                  strsm_::j = strsm_::k + 1;
                  if (strsm_::k < iVar21) {
                    iVar10 = iVar22 * strsm_::j;
                    iVar27 = strsm_::j;
                    do {
                      fVar30 = a[uVar28 + lVar17 * uVar8 + (long)iVar27];
                      if ((fVar30 != 0.0) || (NAN(fVar30))) {
                        uVar1 = *m;
                        if ((int)uVar1 < 1) {
                          lVar19 = 1;
                        }
                        else {
                          lVar19 = 1;
                          do {
                            b[uVar26 + iVar10 + lVar19] =
                                 prVar14[lVar19] * -fVar30 + b[uVar26 + iVar10 + lVar19];
                            lVar19 = lVar19 + 1;
                          } while ((ulong)uVar1 + 1 != lVar19);
                        }
                        strsm_::i__ = (integer)lVar19;
                      }
                      strsm_::j = iVar27 + 1;
                      iVar10 = iVar10 + iVar22;
                      bVar29 = iVar27 < iVar21;
                      iVar27 = strsm_::j;
                    } while (bVar29);
                  }
                  if ((*alpha != 1.0) || (NAN(*alpha))) {
                    uVar1 = *m;
                    if ((int)uVar1 < 1) {
                      lVar19 = 1;
                    }
                    else {
                      lVar19 = 1;
                      do {
                        prVar14[lVar19] = *alpha * prVar14[lVar19];
                        lVar19 = lVar19 + 1;
                      } while ((ulong)uVar1 + 1 != lVar19);
                    }
                    strsm_::i__ = (integer)lVar19;
                  }
                  lVar17 = lVar17 + 1;
                  strsm_::k = (integer)lVar17;
                  prVar14 = prVar14 + uVar9;
                } while (lVar17 != uVar11 + 1);
              }
            }
            else {
              strsm_::k = uVar1;
              if (0 < (int)uVar1) {
                prVar14 = b + uVar26 + uVar9 * uVar11;
                do {
                  if (lVar4 != 0) {
                    uVar1 = *m;
                    if ((int)uVar1 < 1) {
                      lVar17 = 1;
                    }
                    else {
                      fVar30 = a[uVar28 + (long)((iVar24 + 1) * (int)uVar11)];
                      lVar17 = 1;
                      do {
                        prVar14[lVar17] = prVar14[lVar17] * (1.0 / fVar30);
                        lVar17 = lVar17 + 1;
                      } while ((ulong)uVar1 + 1 != lVar17);
                    }
                    strsm_::i__ = (integer)lVar17;
                  }
                  uVar23 = 1;
                  if (1 < (long)uVar11) {
                    uVar23 = 1;
                    prVar20 = b + uVar26 + uVar9;
                    do {
                      fVar30 = a[uVar28 + uVar11 * uVar8 + uVar23];
                      if ((fVar30 != 0.0) || (NAN(fVar30))) {
                        uVar1 = *m;
                        if ((int)uVar1 < 1) {
                          lVar17 = 1;
                        }
                        else {
                          lVar17 = 1;
                          do {
                            prVar20[lVar17] = prVar14[lVar17] * -fVar30 + prVar20[lVar17];
                            lVar17 = lVar17 + 1;
                          } while ((ulong)uVar1 + 1 != lVar17);
                        }
                        strsm_::i__ = (integer)lVar17;
                      }
                      uVar23 = uVar23 + 1;
                      prVar20 = prVar20 + uVar9;
                    } while (uVar23 != uVar11);
                  }
                  if ((*alpha != 1.0) || (NAN(*alpha))) {
                    uVar1 = *m;
                    if ((int)uVar1 < 1) {
                      lVar17 = 1;
                    }
                    else {
                      lVar17 = 1;
                      do {
                        prVar14[lVar17] = *alpha * prVar14[lVar17];
                        lVar17 = lVar17 + 1;
                      } while ((ulong)uVar1 + 1 != lVar17);
                    }
                    strsm_::i__ = (integer)lVar17;
                  }
                  uVar18 = uVar11 - 1;
                  prVar14 = prVar14 + -uVar9;
                  bVar29 = 1 < (long)uVar11;
                  uVar11 = uVar18;
                } while (bVar29);
                strsm_::j = (integer)uVar23;
                strsm_::k = (integer)uVar18;
              }
            }
          }
          else if (lVar5 == 0) {
            strsm_::j = uVar1;
            if (0 < (int)uVar1) {
              iVar21 = *n;
              prVar14 = b + uVar26 + uVar9 * uVar11;
              uVar11 = (ulong)uVar1;
              do {
                if ((*alpha != 1.0) || (NAN(*alpha))) {
                  uVar1 = *m;
                  if ((int)uVar1 < 1) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = 1;
                    do {
                      prVar14[lVar17] = *alpha * prVar14[lVar17];
                      lVar17 = lVar17 + 1;
                    } while ((ulong)uVar1 + 1 != lVar17);
                  }
                  strsm_::i__ = (integer)lVar17;
                }
                iVar27 = (int)uVar11;
                strsm_::k = iVar27 + 1;
                if (iVar27 < iVar21) {
                  iVar16 = iVar22 * strsm_::k;
                  iVar10 = strsm_::k;
                  do {
                    if ((a[uVar28 + uVar11 * uVar8 + (long)iVar10] != 0.0) ||
                       (NAN(a[uVar28 + uVar11 * uVar8 + (long)iVar10]))) {
                      uVar1 = *m;
                      if ((int)uVar1 < 1) {
                        lVar17 = 1;
                      }
                      else {
                        lVar17 = 1;
                        do {
                          prVar14[lVar17] =
                               prVar14[lVar17] -
                               a[uVar28 + uVar11 * uVar8 + (long)iVar10] *
                               b[uVar26 + iVar16 + lVar17];
                          lVar17 = lVar17 + 1;
                        } while ((ulong)uVar1 + 1 != lVar17);
                      }
                      strsm_::i__ = (integer)lVar17;
                    }
                    strsm_::k = iVar10 + 1;
                    iVar16 = iVar16 + iVar22;
                    bVar29 = iVar10 < iVar21;
                    iVar10 = strsm_::k;
                  } while (bVar29);
                }
                if (lVar4 != 0) {
                  uVar1 = *m;
                  if ((int)uVar1 < 1) {
                    lVar17 = 1;
                  }
                  else {
                    fVar30 = a[uVar28 + (long)((iVar24 + 1) * iVar27)];
                    lVar17 = 1;
                    do {
                      prVar14[lVar17] = prVar14[lVar17] * (1.0 / fVar30);
                      lVar17 = lVar17 + 1;
                    } while ((ulong)uVar1 + 1 != lVar17);
                  }
                  strsm_::i__ = (integer)lVar17;
                }
                uVar23 = uVar11 - 1;
                prVar14 = prVar14 + -uVar9;
                bVar29 = 1 < (long)uVar11;
                uVar11 = uVar23;
              } while (bVar29);
              strsm_::j = (integer)uVar23;
            }
          }
          else {
            strsm_::j = 1;
            if (0 < (int)uVar1) {
              uVar23 = 1;
              prVar14 = b + uVar26 + uVar9;
              do {
                if ((*alpha != 1.0) || (NAN(*alpha))) {
                  uVar1 = *m;
                  if ((int)uVar1 < 1) {
                    lVar17 = 1;
                  }
                  else {
                    lVar17 = 1;
                    do {
                      prVar14[lVar17] = *alpha * prVar14[lVar17];
                      lVar17 = lVar17 + 1;
                    } while ((ulong)uVar1 + 1 != lVar17);
                  }
                  strsm_::i__ = (integer)lVar17;
                }
                uVar18 = 1;
                if (1 < uVar23) {
                  uVar18 = 1;
                  prVar20 = b + uVar26 + uVar9;
                  do {
                    if ((a[uVar28 + uVar23 * uVar8 + uVar18] != 0.0) ||
                       (NAN(a[uVar28 + uVar23 * uVar8 + uVar18]))) {
                      uVar1 = *m;
                      if ((int)uVar1 < 1) {
                        lVar17 = 1;
                      }
                      else {
                        lVar17 = 1;
                        do {
                          prVar14[lVar17] =
                               prVar14[lVar17] -
                               a[uVar28 + uVar23 * uVar8 + uVar18] * prVar20[lVar17];
                          lVar17 = lVar17 + 1;
                        } while ((ulong)uVar1 + 1 != lVar17);
                      }
                      strsm_::i__ = (integer)lVar17;
                    }
                    uVar18 = uVar18 + 1;
                    prVar20 = prVar20 + uVar9;
                  } while (uVar18 != uVar23);
                }
                if (lVar4 != 0) {
                  uVar1 = *m;
                  if ((int)uVar1 < 1) {
                    lVar17 = 1;
                  }
                  else {
                    fVar30 = a[uVar28 + (long)((iVar24 + 1) * (int)uVar23)];
                    lVar17 = 1;
                    do {
                      prVar14[lVar17] = prVar14[lVar17] * (1.0 / fVar30);
                      lVar17 = lVar17 + 1;
                    } while ((ulong)uVar1 + 1 != lVar17);
                  }
                  strsm_::i__ = (integer)lVar17;
                }
                uVar23 = uVar23 + 1;
                prVar14 = prVar14 + uVar9;
              } while (uVar23 != uVar11 + 1);
              strsm_::j = (integer)uVar23;
              strsm_::k = (integer)uVar18;
            }
          }
        }
        else {
          strsm_::j = 1;
          if (lVar6 == 0) {
            if (lVar5 == 0) {
              if (0 < (int)uVar1) {
                uVar1 = *m;
                lVar17 = 1;
                do {
                  uVar23 = (ulong)uVar1;
                  if (0 < (int)uVar1) {
                    lVar19 = lVar17 * uVar9;
                    iVar22 = *m;
                    uVar18 = (ulong)uVar1;
                    iVar21 = uVar1 + 1;
                    do {
                      iVar27 = iVar21;
                      if (iVar21 < iVar22) {
                        iVar27 = iVar22;
                      }
                      fVar30 = *alpha * b[uVar26 + lVar19 + uVar18];
                      iVar10 = (int)uVar18;
                      iVar16 = iVar10 + 1;
                      strsm_::k = iVar16;
                      if (iVar10 < iVar22) {
                        iVar25 = iVar16;
                        if (iVar16 < iVar22) {
                          iVar25 = iVar22;
                        }
                        strsm_::k = iVar25 + 1;
                        do {
                          fVar30 = fVar30 - a[uVar28 + uVar18 * uVar8 + (long)iVar16] *
                                            b[uVar26 + lVar19 + iVar16];
                          bVar29 = iVar16 != iVar27;
                          iVar16 = iVar16 + 1;
                        } while (bVar29);
                      }
                      if (lVar4 != 0) {
                        fVar30 = fVar30 / a[uVar28 + (long)((iVar24 + 1) * iVar10)];
                      }
                      b[uVar26 + lVar19 + uVar18] = fVar30;
                      uVar23 = uVar18 - 1;
                      iVar21 = iVar21 + -1;
                      bVar29 = 1 < (long)uVar18;
                      uVar18 = uVar23;
                    } while (bVar29);
                  }
                  lVar17 = lVar17 + 1;
                } while (lVar17 != uVar11 + 1);
                strsm_::i__ = (integer)uVar23;
                strsm_::j = (integer)lVar17;
              }
            }
            else if (0 < (int)uVar1) {
              uVar1 = *m;
              prVar14 = b + uVar26 + uVar9 + 1;
              lVar17 = 1;
              do {
                if ((int)uVar1 < 1) {
                  uVar23 = 1;
                }
                else {
                  iVar22 = -1;
                  uVar23 = 1;
                  lVar19 = 0;
                  prVar20 = a + uVar8 + uVar28 + 1;
                  do {
                    fVar30 = *alpha * b[uVar26 + lVar17 * uVar9 + uVar23];
                    strsm_::k = 1;
                    if (1 < uVar23) {
                      strsm_::k = iVar22 + 2;
                      lVar12 = 0;
                      do {
                        fVar30 = fVar30 - prVar20[lVar12] * prVar14[lVar12];
                        lVar12 = lVar12 + 1;
                      } while (lVar19 != lVar12);
                    }
                    if (lVar4 != 0) {
                      fVar30 = fVar30 / a[uVar28 + (long)((iVar24 + 1) * (int)uVar23)];
                    }
                    b[uVar26 + lVar17 * uVar9 + uVar23] = fVar30;
                    uVar23 = uVar23 + 1;
                    iVar22 = iVar22 + 1;
                    prVar20 = prVar20 + uVar8;
                    lVar19 = lVar19 + 1;
                  } while (uVar23 != (ulong)uVar1 + 1);
                }
                lVar17 = lVar17 + 1;
                prVar14 = prVar14 + uVar9;
              } while (lVar17 != uVar11 + 1);
              strsm_::i__ = (integer)uVar23;
              strsm_::j = (integer)lVar17;
            }
          }
          else if (lVar5 == 0) {
            if (0 < (int)uVar1) {
              uVar1 = *m;
              prVar14 = b + uVar9 + uVar26;
              lVar17 = 1;
              do {
                if ((*alpha != 1.0) || (NAN(*alpha))) {
                  uVar2 = *m;
                  if ((int)uVar2 < 1) {
                    lVar19 = 1;
                  }
                  else {
                    lVar19 = 1;
                    do {
                      prVar14[lVar19] = *alpha * prVar14[lVar19];
                      lVar19 = lVar19 + 1;
                    } while ((ulong)uVar2 + 1 != lVar19);
                  }
                  strsm_::i__ = (integer)lVar19;
                }
                if ((int)uVar1 < 1) {
                  lVar19 = 1;
                }
                else {
                  lVar12 = lVar17 * uVar9;
                  lVar19 = 1;
                  iVar22 = 2;
                  do {
                    fVar30 = b[uVar26 + lVar12 + lVar19];
                    if ((fVar30 != 0.0) || (NAN(fVar30))) {
                      iVar21 = (int)lVar19;
                      if (lVar4 != 0) {
                        b[uVar26 + lVar12 + lVar19] =
                             fVar30 / a[uVar28 + (long)((iVar24 + 1) * iVar21)];
                      }
                      iVar27 = *m;
                      iVar10 = iVar21 + 1;
                      strsm_::i__ = iVar10;
                      if (iVar21 < iVar27) {
                        if (iVar27 <= iVar22) {
                          iVar27 = iVar22;
                        }
                        do {
                          lVar13 = (long)iVar10;
                          b[uVar26 + lVar12 + lVar13] =
                               b[uVar26 + lVar12 + lVar13] -
                               b[uVar26 + lVar12 + lVar19] * a[uVar28 + lVar19 * uVar8 + lVar13];
                          strsm_::i__ = iVar10 + 1;
                          bVar29 = iVar10 != iVar27;
                          iVar10 = strsm_::i__;
                        } while (bVar29);
                      }
                    }
                    lVar19 = lVar19 + 1;
                    iVar22 = iVar22 + 1;
                  } while (lVar19 != (ulong)uVar1 + 1);
                }
                lVar17 = lVar17 + 1;
                prVar14 = prVar14 + uVar9;
              } while (lVar17 != uVar11 + 1);
              strsm_::j = (integer)lVar17;
              strsm_::k = (integer)lVar19;
            }
          }
          else if (0 < (int)uVar1) {
            uVar1 = *m;
            prVar14 = b + uVar9 + uVar26;
            lVar17 = 1;
            do {
              if ((*alpha != 1.0) || (NAN(*alpha))) {
                uVar2 = *m;
                if ((int)uVar2 < 1) {
                  lVar19 = 1;
                }
                else {
                  lVar19 = 1;
                  do {
                    prVar14[lVar19] = *alpha * prVar14[lVar19];
                    lVar19 = lVar19 + 1;
                  } while ((ulong)uVar2 + 1 != lVar19);
                }
                strsm_::i__ = (integer)lVar19;
              }
              uVar23 = (ulong)uVar1;
              if (0 < (int)uVar1) {
                lVar19 = lVar17 * uVar9;
                prVar20 = a + uVar8 * uVar1 + uVar28;
                uVar18 = (ulong)uVar1;
                do {
                  fVar30 = b[uVar26 + lVar19 + uVar18];
                  if ((fVar30 != 0.0) || (NAN(fVar30))) {
                    if (lVar4 != 0) {
                      b[uVar26 + lVar19 + uVar18] =
                           fVar30 / a[uVar28 + (long)((iVar24 + 1) * (int)uVar18)];
                    }
                    uVar23 = 1;
                    if (1 < (long)uVar18) {
                      uVar23 = 1;
                      do {
                        prVar14[uVar23] =
                             prVar14[uVar23] - b[uVar26 + lVar19 + uVar18] * prVar20[uVar23];
                        uVar23 = uVar23 + 1;
                      } while (uVar18 != uVar23);
                    }
                    strsm_::i__ = (integer)uVar23;
                  }
                  uVar23 = uVar18 - 1;
                  prVar20 = prVar20 + -uVar8;
                  bVar29 = 1 < (long)uVar18;
                  uVar18 = uVar23;
                } while (bVar29);
              }
              lVar17 = lVar17 + 1;
              prVar14 = prVar14 + uVar9;
            } while (lVar17 != uVar11 + 1);
            strsm_::j = (integer)lVar17;
            strsm_::k = (integer)uVar23;
          }
        }
      }
      else {
        strsm_::j = 1;
        if (0 < (int)uVar1) {
          uVar2 = *m;
          iVar24 = iVar22 + 1;
          uVar8 = 0;
          do {
            if ((int)uVar2 < 1) {
              iVar21 = 1;
            }
            else {
              memset(b + uVar26 + (long)iVar24,0,(ulong)uVar2 << 2);
              iVar21 = uVar2 + 1;
            }
            uVar8 = uVar8 + 1;
            iVar24 = iVar24 + iVar22;
          } while (uVar1 != uVar8);
          strsm_::i__ = iVar21;
          strsm_::j = (int)uVar8 + 1;
        }
      }
    }
  }
  else {
    xerbla_("STRSM ",&strsm_::info);
  }
  return 0;
}

Assistant:

int strsm_(char *side, char *uplo, char *transa, char *diag,
	integer *m, integer *n, real *alpha, real *a, integer *lda, real *b,
	integer *ldb)
{
    /* System generated locals */
    integer a_dim1, a_offset, b_dim1, b_offset, i__1, i__2, i__3;

    /* Local variables */
    static integer i__, j, k, info;
    static real temp;
    static logical lside;
    extern logical lsame_(char *, char *);
    static integer nrowa;
    static logical upper;
    extern /* Subroutine */ int xerbla_(char *, integer *);
    static logical nounit;


/*
    Purpose
    =======

    STRSM  solves one of the matrix equations

       op( A )*X = alpha*B,   or   X*op( A ) = alpha*B,

    where alpha is a scalar, X and B are m by n matrices, A is a unit, or
    non-unit,  upper or lower triangular matrix  and  op( A )  is one  of

       op( A ) = A   or   op( A ) = A'.

    The matrix X is overwritten on B.

    Parameters
    ==========

    SIDE   - CHARACTER*1.
             On entry, SIDE specifies whether op( A ) appears on the left
             or right of X as follows:

                SIDE = 'L' or 'l'   op( A )*X = alpha*B.

                SIDE = 'R' or 'r'   X*op( A ) = alpha*B.

             Unchanged on exit.

    UPLO   - CHARACTER*1.
             On entry, UPLO specifies whether the matrix A is an upper or
             lower triangular matrix as follows:

                UPLO = 'U' or 'u'   A is an upper triangular matrix.

                UPLO = 'L' or 'l'   A is a lower triangular matrix.

             Unchanged on exit.

    TRANSA - CHARACTER*1.
             On entry, TRANSA specifies the form of op( A ) to be used in
             the matrix multiplication as follows:

                TRANSA = 'N' or 'n'   op( A ) = A.

                TRANSA = 'T' or 't'   op( A ) = A'.

                TRANSA = 'C' or 'c'   op( A ) = A'.

             Unchanged on exit.

    DIAG   - CHARACTER*1.
             On entry, DIAG specifies whether or not A is unit triangular
             as follows:

                DIAG = 'U' or 'u'   A is assumed to be unit triangular.

                DIAG = 'N' or 'n'   A is not assumed to be unit
                                    triangular.

             Unchanged on exit.

    M      - INTEGER.
             On entry, M specifies the number of rows of B. M must be at
             least zero.
             Unchanged on exit.

    N      - INTEGER.
             On entry, N specifies the number of columns of B.  N must be
             at least zero.
             Unchanged on exit.

    ALPHA  - REAL            .
             On entry,  ALPHA specifies the scalar  alpha. When  alpha is
             zero then  A is not referenced and  B need not be set before
             entry.
             Unchanged on exit.

    A      - REAL             array of DIMENSION ( LDA, k ), where k is m
             when  SIDE = 'L' or 'l'  and is  n  when  SIDE = 'R' or 'r'.
             Before entry  with  UPLO = 'U' or 'u',  the  leading  k by k
             upper triangular part of the array  A must contain the upper
             triangular matrix  and the strictly lower triangular part of
             A is not referenced.
             Before entry  with  UPLO = 'L' or 'l',  the  leading  k by k
             lower triangular part of the array  A must contain the lower
             triangular matrix  and the strictly upper triangular part of
             A is not referenced.
             Note that when  DIAG = 'U' or 'u',  the diagonal elements of
             A  are not referenced either,  but are assumed to be  unity.
             Unchanged on exit.

    LDA    - INTEGER.
             On entry, LDA specifies the first dimension of A as declared
             in the calling (sub) program.  When  SIDE = 'L' or 'l'  then
             LDA  must be at least  max( 1, m ),  when  SIDE = 'R' or 'r'
             then LDA must be at least max( 1, n ).
             Unchanged on exit.

    B      - REAL             array of DIMENSION ( LDB, n ).
             Before entry,  the leading  m by n part of the array  B must
             contain  the  right-hand  side  matrix  B,  and  on exit  is
             overwritten by the solution matrix  X.

    LDB    - INTEGER.
             On entry, LDB specifies the first dimension of B as declared
             in  the  calling  (sub)  program.   LDB  must  be  at  least
             max( 1, m ).
             Unchanged on exit.


    Level 3 Blas routine.


    -- Written on 8-February-1989.
       Jack Dongarra, Argonne National Laboratory.
       Iain Duff, AERE Harwell.
       Jeremy Du Croz, Numerical Algorithms Group Ltd.
       Sven Hammarling, Numerical Algorithms Group Ltd.


       Test the input parameters.
*/

    /* Parameter adjustments */
    a_dim1 = *lda;
    a_offset = 1 + a_dim1;
    a -= a_offset;
    b_dim1 = *ldb;
    b_offset = 1 + b_dim1;
    b -= b_offset;

    /* Function Body */
    lside = lsame_(side, "L");
    if (lside) {
	nrowa = *m;
    } else {
	nrowa = *n;
    }
    nounit = lsame_(diag, "N");
    upper = lsame_(uplo, "U");

    info = 0;
    if (! lside && ! lsame_(side, "R")) {
	info = 1;
    } else if (! upper && ! lsame_(uplo, "L")) {
	info = 2;
    } else if (! lsame_(transa, "N") && ! lsame_(transa,
	     "T") && ! lsame_(transa, "C")) {
	info = 3;
    } else if (! lsame_(diag, "U") && ! lsame_(diag,
	    "N")) {
	info = 4;
    } else if (*m < 0) {
	info = 5;
    } else if (*n < 0) {
	info = 6;
    } else if (*lda < max(1,nrowa)) {
	info = 9;
    } else if (*ldb < max(1,*m)) {
	info = 11;
    }
    if (info != 0) {
	xerbla_("STRSM ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0) {
	return 0;
    }

/*     And when  alpha.eq.zero. */

    if (*alpha == 0.f) {
	i__1 = *n;
	for (j = 1; j <= i__1; ++j) {
	    i__2 = *m;
	    for (i__ = 1; i__ <= i__2; ++i__) {
		b[i__ + j * b_dim1] = 0.f;
/* L10: */
	    }
/* L20: */
	}
	return 0;
    }

/*     Start the operations. */

    if (lside) {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*inv( A )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L30: */
			}
		    }
		    for (k = *m; k >= 1; --k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__2 = k - 1;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L40: */
			    }
			}
/* L50: */
		    }
/* L60: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L70: */
			}
		    }
		    i__2 = *m;
		    for (k = 1; k <= i__2; ++k) {
			if (b[k + j * b_dim1] != 0.f) {
			    if (nounit) {
				b[k + j * b_dim1] /= a[k + k * a_dim1];
			    }
			    i__3 = *m;
			    for (i__ = k + 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= b[k + j * b_dim1] * a[
					i__ + k * a_dim1];
/* L80: */
			    }
			}
/* L90: */
		    }
/* L100: */
		}
	    }
	} else {

/*           Form  B := alpha*inv( A' )*B. */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    i__2 = *m;
		    for (i__ = 1; i__ <= i__2; ++i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__3 = i__ - 1;
			for (k = 1; k <= i__3; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L110: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L120: */
		    }
/* L130: */
		}
	    } else {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    for (i__ = *m; i__ >= 1; --i__) {
			temp = *alpha * b[i__ + j * b_dim1];
			i__2 = *m;
			for (k = i__ + 1; k <= i__2; ++k) {
			    temp -= a[k + i__ * a_dim1] * b[k + j * b_dim1];
/* L140: */
			}
			if (nounit) {
			    temp /= a[i__ + i__ * a_dim1];
			}
			b[i__ + j * b_dim1] = temp;
/* L150: */
		    }
/* L160: */
		}
	    }
	}
    } else {
	if (lsame_(transa, "N")) {

/*           Form  B := alpha*B*inv( A ). */

	    if (upper) {
		i__1 = *n;
		for (j = 1; j <= i__1; ++j) {
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L170: */
			}
		    }
		    i__2 = j - 1;
		    for (k = 1; k <= i__2; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L180: */
			    }
			}
/* L190: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L200: */
			}
		    }
/* L210: */
		}
	    } else {
		for (j = *n; j >= 1; --j) {
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = *alpha * b[i__ + j * b_dim1]
				    ;
/* L220: */
			}
		    }
		    i__1 = *n;
		    for (k = j + 1; k <= i__1; ++k) {
			if (a[k + j * a_dim1] != 0.f) {
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= a[k + j * a_dim1] * b[
					i__ + k * b_dim1];
/* L230: */
			    }
			}
/* L240: */
		    }
		    if (nounit) {
			temp = 1.f / a[j + j * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + j * b_dim1] = temp * b[i__ + j * b_dim1];
/* L250: */
			}
		    }
/* L260: */
		}
	    }
	} else {

/*           Form  B := alpha*B*inv( A' ). */

	    if (upper) {
		for (k = *n; k >= 1; --k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L270: */
			}
		    }
		    i__1 = k - 1;
		    for (j = 1; j <= i__1; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__2 = *m;
			    for (i__ = 1; i__ <= i__2; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L280: */
			    }
			}
/* L290: */
		    }
		    if (*alpha != 1.f) {
			i__1 = *m;
			for (i__ = 1; i__ <= i__1; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L300: */
			}
		    }
/* L310: */
		}
	    } else {
		i__1 = *n;
		for (k = 1; k <= i__1; ++k) {
		    if (nounit) {
			temp = 1.f / a[k + k * a_dim1];
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = temp * b[i__ + k * b_dim1];
/* L320: */
			}
		    }
		    i__2 = *n;
		    for (j = k + 1; j <= i__2; ++j) {
			if (a[j + k * a_dim1] != 0.f) {
			    temp = a[j + k * a_dim1];
			    i__3 = *m;
			    for (i__ = 1; i__ <= i__3; ++i__) {
				b[i__ + j * b_dim1] -= temp * b[i__ + k *
					b_dim1];
/* L330: */
			    }
			}
/* L340: */
		    }
		    if (*alpha != 1.f) {
			i__2 = *m;
			for (i__ = 1; i__ <= i__2; ++i__) {
			    b[i__ + k * b_dim1] = *alpha * b[i__ + k * b_dim1]
				    ;
/* L350: */
			}
		    }
/* L360: */
		}
	    }
	}
    }

    return 0;

/*     End of STRSM . */

}